

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger_factory.cpp
# Opt level: O2

void bidfx_public_api::tools::LoggerFactory::SetLogLevel(level_enum level)

{
  _Rb_tree_node_base *p_Var1;
  shared_ptr<spdlog::logger> logger;
  __shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  level_ = level;
  for (p_Var1 = (_Rb_tree_node_base *)loggers_._24_8_;
      p_Var1 != (_Rb_tree_node_base *)(loggers_ + 8);
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    std::__shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_38,(__shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2> *)(p_Var1 + 1));
    LOCK();
    ((local_38._M_ptr)->level_).super___atomic_base<int>._M_i = level;
    UNLOCK();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  }
  return;
}

Assistant:

void LoggerFactory::SetLogLevel(spdlog::level::level_enum level)
{
    level_ = level;
    for(auto logger : loggers_)
    {
        logger->set_level(level);
    }
}